

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

bool __thiscall restincurl::Worker::EvaluateState(Worker *this,bool transfersRunning,bool doDequeue)

{
  int iVar1;
  undefined8 uVar2;
  byte bVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 == 0) {
    bVar3 = this->abort_;
    if (!transfersRunning && (bool)bVar3 == false) {
      bVar3 = this->close_pending_;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return (bool)(bVar3 ^ 1);
  }
  uVar2 = std::__throw_system_error(iVar1);
  __clang_call_terminate(uVar2);
}

Assistant:

bool EvaluateState(const bool transfersRunning, const bool doDequeue) const noexcept {
            lock_t lock(mutex_);

            RESTINCURL_LOG_TRACE("Run loop: transfers_running=" << transfersRunning
                << ", do_dequeue=" << doDequeue
                << ", close_pending_=" << close_pending_);

            return !abort_ && (transfersRunning || !close_pending_);
        }